

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_typed_tests.hpp
# Opt level: O2

void __thiscall
iutest::detail::
TypeParamTestInstance<floatingpoint_test::iu_FloatingpointTest_x_iutest_x_EXP_Test,_iutest::detail::VariadicTypeList<float,_double,_long_double>_>
::EachTest<iutest::detail::VariadicTypeList<double,_long_double>,_void>::EachTest
          (EachTest<iutest::detail::VariadicTypeList<double,_long_double>,_void> *this,
          string *testsuite,char *name,size_t index,char *file,int line)

{
  TestSuite *pTVar1;
  allocator<char> local_59;
  TestInfo *local_58;
  string local_50;
  
  pTVar1 = AddTestSuite(testsuite,index,file,line);
  (this->m_mediator).super_iuITestSuiteMediator.m_test_suite = pTVar1;
  (this->m_mediator).super_iuITestSuiteMediator._vptr_iuITestSuiteMediator =
       (_func_int **)&PTR__iuITestSuiteMediator_0013d3e8;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,name,&local_59);
  local_58 = &this->m_info;
  TestInfo::TestInfo(local_58,(iuITestSuiteMediator *)this,&local_50,
                     &(this->m_factory).super_iuFactoryBase);
  std::__cxx11::string::~string((string *)&local_50);
  (this->m_factory).super_iuFactoryBase._vptr_iuFactoryBase =
       (_func_int **)&PTR__iuFactoryBase_0013d638;
  EachTest<iutest::detail::VariadicTypeList<long_double>,_void>::EachTest
            (&this->m_next,testsuite,name,index + 1,file,line);
  return;
}

Assistant:

EachTest(const ::std::string& testsuite, const char* name, size_t index, const char* file, int line)
            : m_mediator(AddTestSuite(testsuite, index, file, line))
            , m_info(&m_mediator, name, &m_factory)
            , m_next(testsuite, name, index+1, file, line)
        {
        }